

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O2

void ibuf_dequeue(msgbuf *msgbuf,ibuf *buf)

{
  ibuf *piVar1;
  ibuf **ppiVar2;
  ibuf *piVar3;
  
  piVar1 = (buf->entry).tqe_next;
  ppiVar2 = (buf->entry).tqe_prev;
  piVar3 = piVar1;
  if (piVar1 == (ibuf *)0x0) {
    piVar3 = (ibuf *)msgbuf;
  }
  (piVar3->entry).tqe_prev = ppiVar2;
  *ppiVar2 = piVar1;
  if (buf->fd != -1) {
    close(buf->fd);
  }
  msgbuf->queued = msgbuf->queued - 1;
  ibuf_free(buf);
  return;
}

Assistant:

void
ibuf_dequeue(struct msgbuf *msgbuf, struct ibuf *buf)
{
	TAILQ_REMOVE(&msgbuf->bufs, buf, entry);

	if (buf->fd != -1)
		close(buf->fd);

	msgbuf->queued--;
	ibuf_free(buf);
}